

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-shm-sem-writer.c
# Opt level: O2

int main(int argc,char **argv)

{
  int __fd;
  char *pcVar1;
  sem_t *__sem;
  bool bVar2;
  shared_data out_msg;
  
  __fd = shm_open("/shm_AOS",0x42,0x1f8);
  ftruncate(__fd,0x10);
  bVar2 = false;
  pcVar1 = (char *)mmap((void *)0x0,0x10,3,1,__fd,0);
  __sem = sem_open("/sem_AOS",0x40,0x180,1);
  main_common(shutdown);
  builtin_strncpy(out_msg.var1,"John",5);
  out_msg.var1[5] = '\0';
  out_msg.var1[6] = '\0';
  out_msg.var1[7] = '\0';
  out_msg.var1[8] = '\0';
  out_msg.var1[9] = '\0';
  out_msg._10_2_ = 0;
  out_msg.var2 = 0x17;
  while (main_loop == '\0') {
    if (bVar2) {
      puts("Waiting.....");
      sleep(5);
      if (main_loop == '\0') {
        printf("Enter your family name and age: ");
        __isoc99_scanf("%s %d",&out_msg,&out_msg.var2);
      }
    }
    printf(".......Invio ---->Name: %s ,Age: %d\n",&out_msg,(ulong)out_msg._8_8_ >> 0x20);
    sem_wait(__sem);
    *(undefined8 *)pcVar1 = out_msg.var1._0_8_;
    *(undefined8 *)(pcVar1 + 8) = out_msg._8_8_;
    sem_post(__sem);
    bVar2 = true;
  }
  shm_unlink("/shm_AOS");
  sem_close(__sem);
  sem_unlink("/sem_AOS");
  return 0;
}

Assistant:

int main (int argc, char *argv[]) 
{

    int shared_seg_size = (1 * sizeof(struct shared_data));
    
        // ******** shm_open() ***************////// 
    //   shm_open()- opening/creation of a shared memory segment referenced by a name
    //        1) A special file will appear in the file-system under “/dev/shm/” with the provided name.
    //        2) The special file represents a POSIX object and it is created for persistence 
    //        3) ftruncate(...) function resize to memory region to the correct size
    
    int shmfd  = shm_open(SHMOBJ_PATH, O_CREAT | O_RDWR, S_IRWXU | S_IRWXG);
    ftruncate(shmfd, shared_seg_size);
    struct shared_data * shared_msg = (struct shared_data *)mmap(NULL, shared_seg_size, PROT_READ | PROT_WRITE, MAP_SHARED,shmfd, 0);
    
   
    // sem_open()
    // sem_open() – opening/creation of a named semaphore
    //             -Useful for synchronization among unrelated processes
    
    sem_t * sem_id = sem_open(SEM_PATH, O_CREAT, S_IRUSR | S_IWUSR, 1);
    
    main_common(shutdown);
    
    struct shared_data out_msg = {"John", 23 };
    bool first_access=false;

    while(main_loop)
    {
        
        if(!first_access)
            first_access=true;
        else
        {
          printf ("Waiting.....\n");
          sleep(5);
          if(main_loop)
          {
            printf ("Enter your family name and age: ");
            scanf("%s %d",out_msg.var1,&out_msg.var2);
          }
        }
        
        printf(".......Invio ---->Name: %s ,Age: %d\n",out_msg.var1,out_msg.var2);
        
        // sem_wait() 
        // sem_wait() – Decrement the counter and lock if counter = 0
        //              Initial counter value can be set to > 1   USE sem_init to increase the value of the counter // sem_init(sem_t *sem, int pshared, unsigned int value);
                                                                                                                    // sem=sem type; // pshared with other processes or thread
                                                                                                                    // value=counter
        sem_wait(sem_id);

                
        /* Update shared data */
        memcpy(shared_msg, &out_msg, sizeof(struct shared_data));
        
        // sem_post()
        // sem_post() – Increment the count and unlock the critical section if counter > 0
        
        sem_post(sem_id);

     }
    
    //  shm_unlink()
    //  shm_unlink() – removal of shared memory segment object if nobody is referencing it
    shm_unlink(SHMOBJ_PATH);
    
    //sem_close()
    //sem_close() – Close all the references to the named semaphore
    sem_close(sem_id);
    
    //sem_unlink
    //sem_unlink() – Destroy semaphore object 
    //               if all the references have been closed
    sem_unlink(SEM_PATH);


    return 0;
}